

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyline::~IfcPolyline(IfcPolyline *this)

{
  void *pvVar1;
  
  *(undefined ***)&this[-1].super_IfcBoundedCurve.super_IfcCurve.field_0x40 =
       &PTR__IfcPolyline_00824e60;
  *(undefined ***)
   &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x28 =
       &PTR__IfcPolyline_00824f28;
  *(undefined ***)&this[-1].super_IfcBoundedCurve.field_0x50 = &PTR__IfcPolyline_00824e88;
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcPolyline_00824eb0;
  *(undefined ***)&this[-1].field_0x70 = &PTR__IfcPolyline_00824ed8;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcPolyline_00824f00;
  pvVar1 = *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcBoundedCurve).super_IfcCurve.
                                     super_IfcGeometricRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcBoundedCurve.super_IfcCurve.field_0x40,0x80);
  return;
}

Assistant:

IfcPolyline() : Object("IfcPolyline") {}